

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

void __thiscall ixy::IxgbeDevice::init_link(IxgbeDevice *this)

{
  if (0x429f < this->len - 4) {
    if (0x429f < this->len - 4) {
      *(uint *)(this->addr + 0x42a0) = *(uint *)(this->addr + 0x42a0) & 0xffff1fff | 0x6000;
      if (this->len - 4 < 0x42a0) goto LAB_00106810;
      if (0x429f < this->len - 4) {
        *(uint *)(this->addr + 0x42a0) = *(uint *)(this->addr + 0x42a0) & 0xfffffe7f;
        if (this->len - 4 < 0x42a0) goto LAB_00106810;
        if (0x429f < this->len - 4) {
          *(uint *)(this->addr + 0x42a0) = *(uint *)(this->addr + 0x42a0) | 0x1000;
          return;
        }
      }
    }
    __assert_fail("reg <= len - 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                  ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
  }
LAB_00106810:
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

void IxgbeDevice::init_link() {
    // should already be set by the eeprom config, maybe we shouldn't override it here to support weirdo nics?
    set_reg32(IXGBE_AUTOC, (get_reg32(IXGBE_AUTOC) & ~IXGBE_AUTOC_LMS_MASK) | IXGBE_AUTOC_LMS_10G_SERIAL);
    set_reg32(IXGBE_AUTOC, (get_reg32(IXGBE_AUTOC) & ~IXGBE_AUTOC_10G_PMA_PMD_MASK) | IXGBE_AUTOC_10G_XAUI);
    // negotiate link
    set_flags32(IXGBE_AUTOC, IXGBE_AUTOC_AN_RESTART);
    // datasheet wants us to wait for the link here, but we can continue and wait afterwards
}